

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpression.cpp
# Opt level: O2

Token * __thiscall
hdc::LiteralExpression::get_token(Token *__return_storage_ptr__,LiteralExpression *this)

{
  Token::Token(__return_storage_ptr__,&this->token);
  return __return_storage_ptr__;
}

Assistant:

Token LiteralExpression::get_token() {
    return token;
}